

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineRobustnessCreateInfoEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericStringRef<char> local_80;
  GenericStringRef<char> local_70;
  GenericStringRef<char> local_60;
  GenericStringRef<char> local_50;
  GenericStringRef<char> local_40;
  undefined1 local_30 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkPipelineRobustnessCreateInfoEXT *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_40,(char (*) [6])0x61bcb2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_40,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<15u>
            (&local_50,(char (*) [15])"storageBuffers");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkPipelineRobustnessBufferBehavior>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_50,create_info->storageBuffers,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_60,(char (*) [13])"vertexInputs");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkPipelineRobustnessBufferBehavior>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_60,create_info->vertexInputs,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<15u>
            (&local_70,(char (*) [15])"uniformBuffers");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkPipelineRobustnessBufferBehavior>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_70,create_info->uniformBuffers,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_80,(char (*) [7])"images");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkPipelineRobustnessImageBehavior>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_80,create_info->images,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_30);
  return true;
}

Assistant:

static bool json_value(const VkPipelineRobustnessCreateInfoEXT &create_info,
                       Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("storageBuffers", create_info.storageBuffers, alloc);
	value.AddMember("vertexInputs", create_info.vertexInputs, alloc);
	value.AddMember("uniformBuffers", create_info.uniformBuffers, alloc);
	value.AddMember("images", create_info.images, alloc);
	*out_value = value;
	return true;
}